

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::GatherTesselationShader::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 400               \nin vec4 v_in_0;            \nout vec4 d;                \nvoid main() {              \n   gl_Position = vec4(0, 0, 0, 1); \n   d = v_in_0;             \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 400               \n"
			   "in vec4 v_in_0;            \n"
			   "out vec4 d;                \n"
			   "void main() {              \n"
			   "   gl_Position = vec4(0, 0, 0, 1); \n"
			   "   d = v_in_0;             \n"
			   "}";
	}